

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O3

Format __thiscall
QRhiImplementation::shaderDescVariableFormatToVertexInputFormat
          (QRhiImplementation *this,VariableType type)

{
  Format FVar1;
  
  FVar1 = Float4;
  switch(type) {
  case Float:
    return Float;
  case Vec2:
  case Int:
    return type;
  case Vec3:
    FVar1 = Float3;
switchD_0044af42_caseD_4:
    return FVar1;
  case Vec4:
    goto switchD_0044af42_caseD_4;
  case Mat2:
  case Mat2x3:
  case Mat2x4:
  case Mat3:
  case Mat3x2:
  case Mat3x4:
  case Mat4:
  case Mat4x2:
  case Mat4x3:
    return *(Format *)(&DAT_006a35fc + (long)(int)type * 4);
  case Int2:
    return SInt2;
  case Int3:
    return SInt3;
  case Int4:
    return SInt4;
  case Uint:
    return UInt;
  case Uint2:
    return UInt2;
  case Uint3:
    return UInt3;
  case Uint4:
    return UInt4;
  default:
    FVar1 = (*(code *)(&DAT_006a3408 + *(int *)(&DAT_006a3408 + (ulong)(type - Half) * 4)))();
    return FVar1;
  }
}

Assistant:

QRhiVertexInputAttribute::Format QRhiImplementation::shaderDescVariableFormatToVertexInputFormat(QShaderDescription::VariableType type) const
{
    switch (type) {
    case QShaderDescription::Vec4:
        return QRhiVertexInputAttribute::Float4;
    case QShaderDescription::Vec3:
        return QRhiVertexInputAttribute::Float3;
    case QShaderDescription::Vec2:
        return QRhiVertexInputAttribute::Float2;
    case QShaderDescription::Float:
        return QRhiVertexInputAttribute::Float;

    case QShaderDescription::Int4:
        return QRhiVertexInputAttribute::SInt4;
    case QShaderDescription::Int3:
        return QRhiVertexInputAttribute::SInt3;
    case QShaderDescription::Int2:
        return QRhiVertexInputAttribute::SInt2;
    case QShaderDescription::Int:
        return QRhiVertexInputAttribute::SInt;

    case QShaderDescription::Uint4:
        return QRhiVertexInputAttribute::UInt4;
    case QShaderDescription::Uint3:
        return QRhiVertexInputAttribute::UInt3;
    case QShaderDescription::Uint2:
        return QRhiVertexInputAttribute::UInt2;
    case QShaderDescription::Uint:
        return QRhiVertexInputAttribute::UInt;

    case QShaderDescription::Half4:
        return QRhiVertexInputAttribute::Half4;
    case QShaderDescription::Half3:
        return QRhiVertexInputAttribute::Half3;
    case QShaderDescription::Half2:
        return QRhiVertexInputAttribute::Half2;
    case QShaderDescription::Half:
        return QRhiVertexInputAttribute::Half;

    default:
        Q_UNREACHABLE_RETURN(QRhiVertexInputAttribute::Float);
    }
}